

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.cpp
# Opt level: O0

void __thiscall Refal2::CError::ResetMessage(CError *this)

{
  CError *this_local;
  
  std::__cxx11::string::clear();
  resetCache(this);
  return;
}

Assistant:

void CError::ResetMessage()
{
	message.clear();
	resetCache();
}